

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddVariable
          (InstructionBuilder *this,uint32_t type_id,uint32_t storage_class)

{
  IRContext *c;
  uint32_t res_id;
  Instruction *pIVar1;
  string message;
  size_type __dnew;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  undefined1 local_a8 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._24_8_ = local_78 + 0x10;
  local_78._0_8_ = &PTR__SmallVector_003d7c78;
  local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_78._16_4_ = storage_class;
  local_78._8_8_ = 1;
  local_a8._0_4_ = 1;
  local_a8._8_8_ = &PTR__SmallVector_003d7c78;
  local_a8._16_8_ = (_func_int **)0x0;
  local_a8._32_8_ = local_a8 + 0x18;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_78);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_a8);
  local_a8._8_8_ = &PTR__SmallVector_003d7c78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_78._0_8_ = &PTR__SmallVector_003d7c78;
  if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_58,local_58._M_head_impl);
  }
  pIVar1 = (Instruction *)operator_new(0x70);
  c = this->context_;
  res_id = Module::TakeNextIdBound
                     ((c->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((c->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_a8._0_8_ = (long)local_a8 + 0x10;
    local_78._0_8_ = (_func_int **)0x25;
    local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)local_78);
    local_a8._16_8_ = local_78._0_8_;
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    next_node_ = (Instruction *)0x797254202e776f6c;
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    previous_node_ = (Instruction *)0x676e696e6e757220;
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    is_sentinel_ = true;
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x19 = 'c';
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1a = 'o';
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1b = 'm';
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1c = 'p';
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1d = 'a';
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1e = 'c';
    (((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1f = 't';
    *(undefined8 *)
     &(((Instruction *)local_a8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      field_0x1d = 0x2e7364692d746361;
    local_a8._8_8_ = local_78._0_8_;
    *(char *)((long)&(((Instruction *)local_a8._0_8_)->
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase +
             local_78._0_8_) = '\0';
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = 0;
    local_78._16_4_ = (array<signed_char,_4UL>)0x0;
    local_78._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&c->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_78,(char *)local_a8._0_8_);
    if ((Instruction *)local_a8._0_8_ != (Instruction *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
  }
  Instruction::Instruction(pIVar1,c,OpVariable,type_id,res_id,&local_48);
  local_a8._0_8_ = pIVar1;
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)local_a8);
  if ((Instruction *)local_a8._0_8_ != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_a8._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  return pIVar1;
}

Assistant:

Instruction* AddVariable(uint32_t type_id, uint32_t storage_class) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {storage_class}});
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpVariable, type_id,
                        GetContext()->TakeNextId(), operands));
    return AddInstruction(std::move(new_inst));
  }